

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O2

Aig_Obj_t * Aig_ObjChild1CopyVec(Vec_Ptr_t *vCopy,Aig_Obj_t *pObj)

{
  void *pvVar1;
  int i;
  
  if (pObj->pFanin1 == (Aig_Obj_t *)0x0) {
    i = -1;
  }
  else {
    i = *(int *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x24);
  }
  pvVar1 = Vec_PtrEntry(vCopy,i);
  return (Aig_Obj_t *)((ulong)pvVar1 ^ (ulong)((uint)pObj->pFanin1 & 1));
}

Assistant:

static inline Aig_Obj_t *  Aig_ObjChild1CopyVec( Vec_Ptr_t * vCopy, Aig_Obj_t * pObj )  
{ return Aig_NotCond((Aig_Obj_t *)Vec_PtrEntry(vCopy, Aig_ObjFaninId1(pObj)), Aig_ObjFaninC1(pObj));  }